

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O3

uo_cb * uo_cb_create(void)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  void *pvVar4;
  long in_FS_OFFSET;
  
  uo_cb_linkpool_grow(0x20);
  plVar1 = *(long **)(in_FS_OFFSET + -0x38);
  lVar2 = *plVar1;
  plVar3 = (long *)plVar1[1];
  *(long **)(lVar2 + 8) = plVar3;
  *plVar3 = lVar2;
  *plVar1 = 0;
  plVar1[1] = 0;
  plVar1[4] = 4;
  plVar1[3] = 0;
  pvVar4 = malloc(0x20);
  plVar1[2] = (long)pvVar4;
  plVar1[6] = (long)(plVar1 + 5);
  plVar1[5] = (long)(plVar1 + 5);
  return (uo_cb *)(plVar1 + 2);
}

Assistant:

uo_cb *uo_cb_create()
{
    uo_cb *cb = &uo_cb_linkpool_rent()->item;
    uo_stack_create_at(&cb->stack, 0);
    uo_linklist_selflink(&cb->funclist);

    return cb;
}